

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.h
# Opt level: O3

TimeJob * __thiscall
r_exec::_Mem::JobQueue<r_exec::TimeJob>::popJob(JobQueue<r_exec::TimeJob> *this)

{
  _Map_pointer pppTVar1;
  _Elt_pointer ppTVar2;
  TimeJob *pTVar3;
  int iVar4;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->m_popMutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar4 == 0) {
    do {
      pppTVar1 = (this->m_jobs).c.
                 super__Deque_base<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node;
      ppTVar2 = (this->m_jobs).c.
                super__Deque_base<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      if (((long)(this->m_jobs).c.
                 super__Deque_base<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_>._M_impl.
                 super__Deque_impl_data._M_start._M_last - (long)ppTVar2 >> 3) +
          ((long)(this->m_jobs).c.
                 super__Deque_base<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur -
           (long)(this->m_jobs).c.
                 super__Deque_base<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_first >> 3) +
          ((((ulong)((long)pppTVar1 -
                    (long)(this->m_jobs).c.
                          super__Deque_base<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(pppTVar1 == (_Map_pointer)0x0)) * 0x40 != 0) {
        pTVar3 = *ppTVar2;
        std::deque<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_>::pop_front
                  (&(this->m_jobs).c);
        pppTVar1 = (this->m_jobs).c.
                   super__Deque_base<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node;
        if (((long)(this->m_jobs).c.
                   super__Deque_base<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_>._M_impl.
                   super__Deque_impl_data._M_start._M_last -
             (long)(this->m_jobs).c.
                   super__Deque_base<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_>._M_impl.
                   super__Deque_impl_data._M_start._M_cur >> 3) +
            ((long)(this->m_jobs).c.
                   super__Deque_base<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur -
             (long)(this->m_jobs).c.
                   super__Deque_base<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_first >> 3) +
            ((((ulong)((long)pppTVar1 -
                      (long)(this->m_jobs).c.
                            super__Deque_base<r_exec::TimeJob_*,_std::allocator<r_exec::TimeJob_*>_>
                            ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
            (ulong)(pppTVar1 == (_Map_pointer)0x0)) * 0x40 < 0x400) {
          std::condition_variable::notify_all();
        }
        pthread_mutex_unlock((pthread_mutex_t *)this);
        std::unique_lock<std::mutex>::~unique_lock(&local_28);
        return pTVar3;
      }
      pthread_mutex_unlock((pthread_mutex_t *)this);
      std::condition_variable::wait((unique_lock *)&this->m_canPopCondition);
      iVar4 = pthread_mutex_lock((pthread_mutex_t *)this);
    } while (iVar4 == 0);
  }
  std::__throw_system_error(iVar4);
}

Assistant:

Type *popJob()
        {
            std::unique_lock<std::mutex> lock(m_popMutex);
            m_mutex.lock();

            while (m_jobs.size() < 1) { // while, because of spurious wakeups
                m_mutex.unlock();
                m_canPopCondition.wait(lock);
                m_mutex.lock();
            }

            Type *r = m_jobs.front();
            m_jobs.pop();

            if (m_jobs.size() < 1024) {
                m_canPushCondition.notify_all();
            }

            m_mutex.unlock();
            return r;
        }